

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

Response * __thiscall
prometheus::anon_unknown_0::IntegrationTest::FetchMetrics
          (Response *__return_storage_ptr__,IntegrationTest *this,string *metrics_path)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  Response *extraout_RAX;
  Response *extraout_RAX_00;
  Response *pRVar4;
  runtime_error *prVar5;
  shared_ptr<void> curl;
  char *ct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  char *local_48;
  undefined1 local_40 [32];
  
  pcVar3 = (char *)curl_easy_init();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<void*,void(*)(void*),std::allocator<void>,void>(&local_50,pcVar3,curl_easy_cleanup)
  ;
  if (pcVar3 == (char *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"failed to initialize libcurl");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &this->base_url_,metrics_path);
  __return_storage_ptr__->code = 0;
  (__return_storage_ptr__->body)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->body).field_2
  ;
  (__return_storage_ptr__->body)._M_string_length = 0;
  (__return_storage_ptr__->body).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->contentType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->contentType).field_2;
  (__return_storage_ptr__->contentType)._M_string_length = 0;
  (__return_storage_ptr__->contentType).field_2._M_local_buf[0] = '\0';
  curl_easy_setopt(pcVar3,0x2712,local_40._0_8_);
  curl_easy_setopt(pcVar3,0x2711,&__return_storage_ptr__->body);
  curl_easy_setopt(pcVar3,0x4e2b,WriteCallback);
  if ((this->fetchPrePerform_).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_48 = pcVar3;
    (*(this->fetchPrePerform_)._M_invoker)((_Any_data *)&this->fetchPrePerform_,&local_48);
  }
  iVar2 = curl_easy_perform(pcVar3);
  if (iVar2 == 0) {
    curl_easy_getinfo(pcVar3,0x200002,__return_storage_ptr__);
    local_48 = (char *)0x0;
    curl_easy_getinfo(pcVar3);
    pcVar3 = local_48;
    if (local_48 != (char *)0x0) {
      pcVar1 = (char *)(__return_storage_ptr__->contentType)._M_string_length;
      strlen(local_48);
      std::__cxx11::string::_M_replace
                ((ulong)&__return_storage_ptr__->contentType,0,pcVar1,(ulong)pcVar3);
    }
    pRVar4 = (Response *)(local_40 + 0x10);
    if ((Response *)local_40._0_8_ != pRVar4) {
      operator_delete((void *)local_40._0_8_);
      pRVar4 = extraout_RAX;
    }
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      pRVar4 = extraout_RAX_00;
    }
    return pRVar4;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"failed to perform HTTP request");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Response FetchMetrics(const std::string& metrics_path) const {
    auto curl = std::shared_ptr<CURL>(curl_easy_init(), curl_easy_cleanup);
    if (!curl) {
      throw std::runtime_error("failed to initialize libcurl");
    }

    const auto url = base_url_ + metrics_path;
    Response response;

    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, &response.body);
    curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, WriteCallback);

    if (fetchPrePerform_) {
      fetchPrePerform_(curl.get());
    }

    CURLcode curl_error = curl_easy_perform(curl.get());
    if (curl_error != CURLE_OK) {
      throw std::runtime_error("failed to perform HTTP request");
    }

    curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &response.code);

    char* ct = nullptr;
    curl_easy_getinfo(curl.get(), CURLINFO_CONTENT_TYPE, &ct);
    if (ct) {
      response.contentType = ct;
    }

    return response;
  }